

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O2

int run_test_udp_no_autobind(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  undefined8 uStack_1c0;
  uv_udp_t h2;
  uv_udp_t h;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&h);
  if (iVar1 == 0) {
    iVar1 = uv_udp_set_multicast_ttl(&h,0x20);
    if (iVar1 == -9) {
      iVar1 = uv_udp_set_broadcast(&h,1);
      if (iVar1 == -9) {
        iVar1 = uv_udp_set_ttl(&h,1);
        if (iVar1 == -9) {
          iVar1 = uv_udp_set_multicast_loop(&h,1);
          if (iVar1 == -9) {
            iVar1 = uv_udp_set_multicast_interface(&h,"0.0.0.0");
            if (iVar1 == -9) {
              uv_close(&h,0);
              iVar1 = uv_udp_init_ex(uVar2,&h2,0x102);
              if (iVar1 == 0) {
                iVar1 = uv_udp_set_multicast_ttl(&h2,0x20);
                if (iVar1 == 0) {
                  iVar1 = uv_udp_set_broadcast(&h2,1);
                  if (iVar1 == 0) {
                    iVar1 = uv_udp_set_ttl(&h2,1);
                    if (iVar1 == 0) {
                      iVar1 = uv_udp_set_multicast_loop(&h2,1);
                      if (iVar1 == 0) {
                        iVar1 = uv_udp_set_multicast_interface(&h2,"0.0.0.0");
                        if (iVar1 == 0) {
                          uv_close(&h2,0);
                          iVar1 = uv_run(uVar2,0);
                          if (iVar1 == 0) {
                            loop = (uv_loop_t *)uv_default_loop();
                            close_loop(loop);
                            uVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(uVar2);
                            if (iVar1 == 0) {
                              uv_library_shutdown();
                              return 0;
                            }
                            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_1c0 = 0x9e;
                          }
                          else {
                            pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                            uStack_1c0 = 0x9c;
                          }
                        }
                        else {
                          pcVar3 = "0 == uv_udp_set_multicast_interface(&h2, \"0.0.0.0\")";
                          uStack_1c0 = 0x98;
                        }
                      }
                      else {
                        pcVar3 = "0 == uv_udp_set_multicast_loop(&h2, 1)";
                        uStack_1c0 = 0x97;
                      }
                    }
                    else {
                      pcVar3 = "0 == uv_udp_set_ttl(&h2, 1)";
                      uStack_1c0 = 0x94;
                    }
                  }
                  else {
                    pcVar3 = "0 == uv_udp_set_broadcast(&h2, 1)";
                    uStack_1c0 = 0x8e;
                  }
                }
                else {
                  pcVar3 = "0 == uv_udp_set_multicast_ttl(&h2, 32)";
                  uStack_1c0 = 0x8d;
                }
              }
              else {
                pcVar3 = "0 == uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG)";
                uStack_1c0 = 0x8c;
              }
            }
            else {
              pcVar3 = "UV_EBADF == uv_udp_set_multicast_interface(&h, \"0.0.0.0\")";
              uStack_1c0 = 0x87;
            }
          }
          else {
            pcVar3 = "UV_EBADF == uv_udp_set_multicast_loop(&h, 1)";
            uStack_1c0 = 0x82;
          }
        }
        else {
          pcVar3 = "UV_EBADF == uv_udp_set_ttl(&h, 1)";
          uStack_1c0 = 0x80;
        }
      }
      else {
        pcVar3 = "UV_EBADF == uv_udp_set_broadcast(&h, 1)";
        uStack_1c0 = 0x7c;
      }
    }
    else {
      pcVar3 = "UV_EBADF == uv_udp_set_multicast_ttl(&h, 32)";
      uStack_1c0 = 0x7b;
    }
  }
  else {
    pcVar3 = "0 == uv_udp_init(loop, &h)";
    uStack_1c0 = 0x7a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-options.c"
          ,uStack_1c0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_no_autobind) {
  uv_loop_t* loop;
  uv_udp_t h;
  uv_udp_t h2;

  loop = uv_default_loop();

  /* Test a lazy initialized socket. */
  ASSERT(0 == uv_udp_init(loop, &h));
  ASSERT(UV_EBADF == uv_udp_set_multicast_ttl(&h, 32));
  ASSERT(UV_EBADF == uv_udp_set_broadcast(&h, 1));
#if defined(__MVS__)
  ASSERT(UV_ENOTSUP == uv_udp_set_ttl(&h, 1));
#else
  ASSERT(UV_EBADF == uv_udp_set_ttl(&h, 1));
#endif
  ASSERT(UV_EBADF == uv_udp_set_multicast_loop(&h, 1));
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  ASSERT(UV_EBADF == uv_udp_set_multicast_interface(&h, "0.0.0.0"));

  uv_close((uv_handle_t*) &h, NULL);

  /* Test a non-lazily initialized socket. */
  ASSERT(0 == uv_udp_init_ex(loop, &h2, AF_INET | UV_UDP_RECVMMSG));
  ASSERT(0 == uv_udp_set_multicast_ttl(&h2, 32));
  ASSERT(0 == uv_udp_set_broadcast(&h2, 1));

#if defined(__MVS__)
  /* zOS only supports setting ttl for IPv6 sockets. */
  ASSERT(UV_ENOTSUP == uv_udp_set_ttl(&h2, 1));
#else
  ASSERT(0 == uv_udp_set_ttl(&h2, 1));
#endif

  ASSERT(0 == uv_udp_set_multicast_loop(&h2, 1));
  ASSERT(0 == uv_udp_set_multicast_interface(&h2, "0.0.0.0"));

  uv_close((uv_handle_t*) &h2, NULL);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}